

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O0

void luaD_seterrorobj(lua_State *L,int errcode,StkId oldtop)

{
  StkId pTVar1;
  GCObject *pGVar2;
  TValue *o1;
  TValue *o2;
  TValue *i_o_1;
  TValue *i_o;
  StkId oldtop_local;
  int errcode_local;
  lua_State *L_local;
  
  if (errcode - 2U < 2) {
    pTVar1 = L->top;
    oldtop->value = pTVar1[-1].value;
    oldtop->tt = pTVar1[-1].tt;
  }
  else if (errcode == 4) {
    pGVar2 = (GCObject *)luaS_newlstr(L,"not enough memory",0x11);
    (oldtop->value).gc = pGVar2;
    oldtop->tt = 4;
  }
  else if (errcode == 5) {
    pGVar2 = (GCObject *)luaS_newlstr(L,"error in error handling",0x17);
    (oldtop->value).gc = pGVar2;
    oldtop->tt = 4;
  }
  L->top = oldtop + 1;
  return;
}

Assistant:

void luaD_seterrorobj (lua_State *L, int errcode, StkId oldtop) {
  switch (errcode) {
    case LUA_ERRMEM: {
      setsvalue2s(L, oldtop, luaS_newliteral(L, MEMERRMSG));
      break;
    }
    case LUA_ERRERR: {
      setsvalue2s(L, oldtop, luaS_newliteral(L, "error in error handling"));
      break;
    }
    case LUA_ERRSYNTAX:
    case LUA_ERRRUN: {
      setobjs2s(L, oldtop, L->top - 1);  /* error message on current top */
      break;
    }
  }
  L->top = oldtop + 1;
}